

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManSetDataSaved(Gli_Man_t *p,int iBit)

{
  Gli_Obj_t *pNode;
  int *piVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  for (lVar4 = 0; lVar4 < p->vCis->nSize; lVar4 = lVar4 + 1) {
    iVar2 = Vec_IntEntry(p->vCis,(int)lVar4);
    piVar1 = p->pObjData;
    if (piVar1 == (int *)0x0) break;
    bVar6 = (p->pSimInfoPrev[lVar4] >> (iBit & 0x1fU) & 1) != 0;
    piVar1[iVar2] = (piVar1[iVar2] & 0xfffffff9U) + (uint)bVar6 * 4 + (uint)bVar6 * 2;
  }
  uVar5 = 0;
  while (((int)uVar5 < p->nObjData && (p->pObjData != (int *)0x0))) {
    pNode = (Gli_Obj_t *)(p->pObjData + uVar5);
    uVar3 = *(uint *)pNode;
    if ((uVar3 & 1) == 0) {
      iVar2 = Gli_NodeComputeValue(pNode);
      uVar3 = (uVar3 & 0xfffffff8) + iVar2 * 6;
      *(uint *)pNode = uVar3;
    }
    uVar5 = uVar5 + (uVar3 >> 7) + (uVar3 >> 4 & 7) + 8;
  }
  return;
}

Assistant:

void Gli_ManSetDataSaved( Gli_Man_t * p, int iBit )
{
    Gli_Obj_t * pObj;
    int i;
    Gli_ManForEachCi( p, pObj, i )
        pObj->fPhase = pObj->fPhase2 = ((p->pSimInfoPrev[i] >> iBit) & 1);
    Gli_ManForEachNode( p, pObj, i )
        pObj->fPhase = pObj->fPhase2 = Gli_NodeComputeValue( pObj );
}